

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O0

void wabt::anon_unknown_0::Mul10(v128 *v)

{
  v128 *pvVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t local_24;
  uint32_t local_20;
  uint32_t carry_into_v3;
  uint32_t carry_into_v2;
  uint32_t carry_into_v1;
  uint32_t kTopBit;
  uint32_t kTopThreeBits;
  v128 *v_local;
  
  carry_into_v1 = 0xe0000000;
  carry_into_v2 = 0x80000000;
  _kTopBit = v;
  uVar2 = v128::u32(v,0);
  uVar3 = v128::u32(_kTopBit,0);
  pvVar1 = _kTopBit;
  carry_into_v3 = (uVar2 >> 0x1d) - ((int)uVar3 >> 0x1f);
  uVar2 = v128::u32(_kTopBit,0);
  uVar3 = v128::u32(_kTopBit,0);
  uVar2 = AddWithCarry(uVar2 << 3,uVar3 << 1,&carry_into_v3);
  v128::set_u32(pvVar1,0,uVar2);
  uVar2 = v128::u32(_kTopBit,1);
  uVar3 = v128::u32(_kTopBit,1);
  pvVar1 = _kTopBit;
  local_20 = (uVar2 >> 0x1d) - ((int)uVar3 >> 0x1f);
  uVar2 = v128::u32(_kTopBit,1);
  uVar3 = v128::u32(_kTopBit,1);
  uVar2 = AddWithCarry(uVar2 << 3,uVar3 << 1,&local_20);
  v128::set_u32(pvVar1,1,uVar2);
  pvVar1 = _kTopBit;
  uVar2 = v128::u32(_kTopBit,1);
  uVar2 = AddWithCarry(uVar2,carry_into_v3,&local_20);
  v128::set_u32(pvVar1,1,uVar2);
  uVar2 = v128::u32(_kTopBit,2);
  uVar3 = v128::u32(_kTopBit,2);
  pvVar1 = _kTopBit;
  local_24 = (uVar2 >> 0x1d) - ((int)uVar3 >> 0x1f);
  uVar2 = v128::u32(_kTopBit,2);
  uVar3 = v128::u32(_kTopBit,2);
  uVar2 = AddWithCarry(uVar2 << 3,uVar3 << 1,&local_24);
  v128::set_u32(pvVar1,2,uVar2);
  pvVar1 = _kTopBit;
  uVar2 = v128::u32(_kTopBit,2);
  uVar2 = AddWithCarry(uVar2,local_20,&local_24);
  v128::set_u32(pvVar1,2,uVar2);
  pvVar1 = _kTopBit;
  uVar2 = v128::u32(_kTopBit,3);
  v128::set_u32(pvVar1,3,uVar2 * 10 + local_24);
  return;
}

Assistant:

void Mul10(v128* v) {
  // Multiply-by-10 decomposes into (x << 3) + (x << 1). We implement those
  // operations with carrying from smaller quads of the v128 to the larger
  // quads.

  constexpr uint32_t kTopThreeBits = 0xe0000000;
  constexpr uint32_t kTopBit = 0x80000000;

  uint32_t carry_into_v1 =
      ((v->u32(0) & kTopThreeBits) >> 29) + ((v->u32(0) & kTopBit) >> 31);
  v->set_u32(0, AddWithCarry(v->u32(0) << 3, v->u32(0) << 1, &carry_into_v1));
  uint32_t carry_into_v2 =
      ((v->u32(1) & kTopThreeBits) >> 29) + ((v->u32(1) & kTopBit) >> 31);
  v->set_u32(1, AddWithCarry(v->u32(1) << 3, v->u32(1) << 1, &carry_into_v2));
  v->set_u32(1, AddWithCarry(v->u32(1), carry_into_v1, &carry_into_v2));
  uint32_t carry_into_v3 =
      ((v->u32(2) & kTopThreeBits) >> 29) + ((v->u32(2) & kTopBit) >> 31);
  v->set_u32(2, AddWithCarry(v->u32(2) << 3, v->u32(2) << 1, &carry_into_v3));
  v->set_u32(2, AddWithCarry(v->u32(2), carry_into_v2, &carry_into_v3));
  v->set_u32(3, v->u32(3) * 10 + carry_into_v3);
}